

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::changeLower(SPxLPBase<double> *this,int i,double *newLower,bool scale)

{
  double *pdVar1;
  byte in_CL;
  double *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  double dVar2;
  int in_stack_ffffffffffffffbc;
  LPColSetBase<double> *in_stack_ffffffffffffffc0;
  LPColSetBase<double> *this_00;
  
  if (((in_CL & 1) != 0) && (dVar2 = *in_RDX, pdVar1 = (double *)infinity(), -*pdVar1 < dVar2)) {
    dVar2 = (double)(**(code **)(**(long **)(in_RDI + 0x1a8) + 0x158))
                              (*in_RDX,*(long **)(in_RDI + 0x1a8),in_RDI,in_ESI);
    pdVar1 = LPColSetBase<double>::lower_w(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    *pdVar1 = dVar2;
    return;
  }
  this_00 = (LPColSetBase<double> *)*in_RDX;
  pdVar1 = LPColSetBase<double>::lower_w(this_00,in_stack_ffffffffffffffbc);
  *pdVar1 = (double)this_00;
  return;
}

Assistant:

virtual void changeLower(int i, const R& newLower, bool scale = false)
   {
      if(scale && newLower > R(-infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::lower_w(i) = lp_scaler->scaleLower(*this, i, newLower);
      }
      else
         LPColSetBase<R>::lower_w(i) = newLower;

      assert(isConsistent());
   }